

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O1

void __thiscall n_pca::NPca::process(NPca *this)

{
  MatrixXd *dst;
  double *pdVar1;
  pointer pcVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  Index size;
  void *pvVar7;
  undefined8 *puVar8;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pPVar9;
  Index size_1;
  char *pcVar10;
  Index index;
  ulong uVar11;
  ulong uVar12;
  Index index_2;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ActualDstType actualDst_1;
  double dVar16;
  undefined1 auVar17 [16];
  RowVectorXd mean_vec_row;
  MatrixXd basic_squre_matrix;
  MatrixXd train_zero_matrix;
  MatrixXd PC;
  MatrixXd C;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> eigenSolver;
  scalar_sum_op<double,_double> local_189;
  void *local_188;
  ulong uStack_180;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_178;
  void *local_140;
  ulong local_138;
  long local_130;
  MatrixXd *local_128;
  DenseStorage<double,__1,__1,__1,_0> local_120;
  undefined1 local_108 [16];
  variable_if_dynamic<long,__1> local_f8;
  void *local_f0;
  long local_e8;
  void *local_d8 [3];
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_c0;
  string local_70;
  string local_50;
  
  pcVar2 = (this->n_config_->train_file_path_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,
             pcVar2 + (this->n_config_->train_file_path_)._M_string_length);
  setTrainMatrix(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar2 = (this->n_config_->test_file_path_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->n_config_->test_file_path_)._M_string_length
            );
  setTestMatrix(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  puts("finished load set...");
  lVar13 = (this->train_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols;
  if (lVar13 < 0) {
    pcVar10 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
    ;
LAB_0010439c:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar10);
  }
  local_c0.m_subdiag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)
         (double)(this->train_matrix_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = (Index)&this->train_matrix_;
  local_c0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = lVar13;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const>,Eigen::internal::assign_op<double,double>>
            (&this->train_mean_,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
              *)&local_c0,(assign_op<double,_double> *)&local_178);
  uVar11 = (this->train_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols;
  if ((long)uVar11 < 0) {
    __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, 1, -1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, 1, -1>>, Level = 0]"
                 );
  }
  pdVar3 = (this->train_mean_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  local_188 = (void *)0x0;
  uStack_180 = 0;
  pvVar7 = local_188;
  uVar4 = uStack_180;
  if (uVar11 != 0) {
    free((void *)0x0);
    uVar4 = uVar11;
    if (uVar11 != 0) {
      if (uVar11 >> 0x3d == 0) {
        pvVar7 = malloc(uVar11 * 8);
        if (uVar11 != 1 && ((ulong)pvVar7 & 0xf) != 0) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pvVar7 != (void *)0x0) goto LAB_00103e7a;
      }
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = __cxa_throw;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pvVar7 = (void *)0x0;
  }
LAB_00103e7a:
  uStack_180 = uVar4;
  local_188 = pvVar7;
  if (uStack_180 != uVar11) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, 1, -1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 1, -1>>, T1 = double, T2 = double]"
                 );
  }
  uVar11 = uStack_180 - ((long)uStack_180 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uStack_180) {
    lVar13 = 0;
    do {
      pdVar5 = pdVar3 + lVar13;
      dVar16 = pdVar5[1];
      pdVar1 = (double *)((long)local_188 + lVar13 * 8);
      *pdVar1 = *pdVar5;
      pdVar1[1] = dVar16;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uStack_180) {
    do {
      *(double *)((long)local_188 + uVar11 * 8) = pdVar3[uVar11];
      uVar11 = uVar11 + 1;
    } while (uStack_180 != uVar11);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_120,(DenseStorage<double,__1,__1,__1,_0> *)&this->train_matrix_);
  local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)&local_120;
  Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator-=
            ((VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_c0,
             (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_188);
  local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)&local_120;
  local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = (Index)&local_120;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_c0);
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_c0,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d8,0x80);
  pPVar9 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
           Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
                     (&local_c0);
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_ =
       SEXT48(this->n_config_->dimension_);
  uVar11 = *(long *)(pPVar9 + 0x10) -
           local_178.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           _16_8_;
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
  m_value = *(long *)(pPVar9 + 8);
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
       (PointerType)
       (*(long *)pPVar9 +
       local_178.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
       m_value * uVar11 * 8);
  if ((local_178.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
       m_value |
      local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_)
      < 0 && *(long *)pPVar9 != 0) {
    pcVar10 = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, -1, true>, Level = 0]"
    ;
LAB_0010433f:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar10);
  }
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
       (XprTypeNested)pPVar9;
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
  m_value = uVar11;
  local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_outerStride =
       local_178.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
       m_value;
  if ((local_178.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
       m_value < 0) ||
     ((long)(uVar11 | local_178.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                      ._16_8_) < 0)) {
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, -1, true>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = true]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,true>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_>
              *)&local_178);
  puts("finished reduce dimension...");
  if (local_120.m_rows == local_e8) {
    local_108._0_8_ = &local_120;
    local_108._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_178,
               (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                *)local_108);
    dst = &this->basic_matrix_;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
              (dst,(Matrix<double,__1,__1,_0,__1,__1> *)&local_178,
               (assign_op<double,_double> *)&local_140);
    free(local_178.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_data);
    local_178.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         (PointerType)dst;
    local_128 = dst;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_140,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_178);
    if (0 < (this->basic_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols) {
      lVar13 = 0;
      uVar11 = 0;
      do {
        pdVar3 = (this->basic_matrix_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
        uVar4 = (this->basic_matrix_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
        if ((long)uVar4 < 0 && pdVar3 != (double *)0x0) {
LAB_0010432a:
          pcVar10 = 
          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
          ;
          goto LAB_0010433f;
        }
        local_178.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = (PointerType)((long)local_140 + local_138 * uVar11 * 8);
        local_178.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows
        .m_value = local_138;
        if ((long)local_138 < 0 && local_140 != (void *)0x0) goto LAB_0010432a;
        local_178.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startRow.m_value = 0;
        local_178.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride = local_138;
        local_178.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             (XprTypeNested)&local_140;
        local_178.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startCol.m_value = uVar11;
        if (local_130 <= (long)uVar11) {
LAB_00104349:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                       );
        }
        if (local_138 == 0) {
          dVar16 = 0.0;
        }
        else {
          if ((long)local_138 < 1) {
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::redux(const Func &) const [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                         );
          }
          local_f8.m_value = local_138;
          local_108._0_8_ =
               local_178.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
               .m_data;
          dVar16 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>,3,0>
                   ::run<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                             ((redux_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)local_108,&local_189,&local_178);
        }
        if (dVar16 < 0.0) {
          dVar16 = sqrt(dVar16);
        }
        else {
          dVar16 = SQRT(dVar16);
        }
        if ((long)uVar4 < 0) {
          pcVar10 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_0010439c;
        }
        pdVar5 = (this->basic_matrix_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
        uVar6 = (this->basic_matrix_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
        if ((long)uVar6 < 0 && pdVar5 != (double *)0x0) goto LAB_0010432a;
        if ((this->basic_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols <= (long)uVar11) goto LAB_00104349;
        if (uVar6 != uVar4) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
                       );
        }
        uVar12 = uVar6;
        if ((((ulong)(pdVar5 + uVar6 * uVar11) & 7) == 0) &&
           (uVar12 = (ulong)((uint)((ulong)(pdVar5 + uVar6 * uVar11) >> 3) & 1),
           (long)uVar6 <= (long)uVar12)) {
          uVar12 = uVar6;
        }
        if (0 < (long)uVar12) {
          uVar15 = 0;
          do {
            *(double *)((long)pdVar5 + uVar15 * 8 + uVar6 * lVar13) =
                 *(double *)((long)pdVar3 + uVar15 * 8 + uVar4 * lVar13) / dVar16;
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
        }
        lVar14 = uVar6 - uVar12;
        uVar15 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
        if (1 < lVar14) {
          do {
            auVar17._8_8_ = dVar16;
            auVar17._0_8_ = dVar16;
            auVar17 = divpd(*(undefined1 (*) [16])((long)pdVar3 + uVar12 * 8 + uVar4 * lVar13),
                            auVar17);
            *(undefined1 (*) [16])((long)pdVar5 + uVar12 * 8 + uVar6 * lVar13) = auVar17;
            uVar12 = uVar12 + 2;
          } while ((long)uVar12 < (long)uVar15);
        }
        if ((long)uVar15 < (long)uVar6) {
          do {
            *(double *)((long)pdVar5 + uVar15 * 8 + uVar6 * lVar13) =
                 *(double *)((long)pdVar3 + uVar15 * 8 + uVar4 * lVar13) / dVar16;
            uVar15 = uVar15 + 1;
          } while (uVar6 != uVar15);
        }
        uVar11 = uVar11 + 1;
        lVar13 = lVar13 + 8;
      } while ((long)uVar11 <
               (this->basic_matrix_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
    }
    if (local_120.m_cols ==
        (this->basic_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_rows) {
      local_108._0_8_ = &local_120;
      local_108._8_8_ = local_128;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_178,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                  *)local_108);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&this->train_data_matrix_,(Matrix<double,__1,__1,_0,__1,__1> *)&local_178,
                 (assign_op<double,_double> *)&local_189);
      free(local_178.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_data);
      puts("finished process...");
      saveData(this);
      free(local_140);
      free(local_f0);
      free(local_c0.m_hcoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_c0.m_subdiag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_c0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_c0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_d8[0]);
      free(local_120.m_data);
      free(local_188);
      return;
    }
    pcVar10 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
    ;
  }
  else {
    pcVar10 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar10);
}

Assistant:

void NPca::process()
{
    setTrainMatrix(n_config_->train_file_path_);
    setTestMatrix(n_config_->test_file_path_);

    printf("finished load set...\n");

    train_mean_ = train_matrix_.colwise().mean();

    RowVectorXd mean_vec_row(RowVectorXd::Map(train_mean_.data(), train_matrix_.cols()));

    MatrixXd train_zero_matrix = train_matrix_;
    train_zero_matrix.rowwise() -= mean_vec_row;

    // calculate covariance
    MatrixXd C = train_zero_matrix * train_zero_matrix.transpose();

    // calculate feature vector and value
    Eigen::SelfAdjointEigenSolver<MatrixXd> eigenSolver(C);

    // reduce dimension
    MatrixXd PC = eigenSolver.eigenvectors().rightCols(n_config_->dimension_);
    printf("finished reduce dimension...\n");

    basic_matrix_ = train_zero_matrix.transpose() * PC;

    MatrixXd basic_squre_matrix = basic_matrix_.array().square();

    // normalization
    for (int i = 0; i < basic_matrix_.cols(); i++)
    {
        basic_matrix_.col(i) = basic_matrix_.col(i)/sqrt(basic_squre_matrix.col(i).sum());
    }

    train_data_matrix_ = train_zero_matrix * basic_matrix_;

    printf("finished process...\n");

    saveData();
}